

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_expr_op * jx9ExprExtractOperator(SyString *pStr,SyToken *pLast)

{
  int iVar1;
  int iVar2;
  jx9_expr_op *pjVar3;
  long lVar4;
  long lVar5;
  jx9_expr_op *pjVar6;
  
  lVar4 = 0;
  lVar5 = 0;
  do {
    if (lVar4 == 0x640) {
      return (jx9_expr_op *)0x0;
    }
    iVar1 = *(int *)((long)&aOpTable[0].sOp.nByte + lVar4);
    iVar2 = pStr->nByte - iVar1;
    if (iVar2 == 0) {
      iVar2 = SyMemcmp(pStr->zString,*(void **)((long)&aOpTable[0].sOp.zString + lVar4),pStr->nByte)
      ;
    }
    if (iVar2 == 0) {
      iVar2 = *(int *)((long)&aOpTable[0].iOp + lVar4);
      if (iVar1 != 1) {
LAB_00121ff2:
        pjVar6 = (jx9_expr_op *)((long)&aOpTable[0].sOp.zString + lVar4);
        pjVar3 = (jx9_expr_op *)0x0;
        if (iVar2 != 2) {
          pjVar3 = pjVar6;
        }
        if (iVar2 != 2 || pLast == (SyToken *)0x0) {
          return pjVar3;
        }
        if ((pLast->nType & 0x1408) != 0) {
          return pjVar6;
        }
        return (jx9_expr_op *)0x0;
      }
      if (iVar2 == 7) {
        if (pLast == (SyToken *)0x0) {
          return aOpTable + lVar5;
        }
      }
      else if ((pLast == (SyToken *)0x0) || (iVar2 != 8)) goto LAB_00121ff2;
      if ((pLast->nType & 0x120a40) != 0) {
        return aOpTable + lVar5;
      }
      if (((pLast->nType & 0x20) != 0) &&
         ((*(uint *)((long)pLast->pUserData + 0x10) & 0xfffffffe) != 4)) {
        return (jx9_expr_op *)((long)&aOpTable[0].sOp.zString + lVar4);
      }
    }
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x20;
  } while( true );
}

Assistant:

JX9_PRIVATE const jx9_expr_op *  jx9ExprExtractOperator(SyString *pStr, SyToken *pLast)
{
	sxu32 n = 0;
	sxi32 rc;
	/* Do a linear lookup on the operators table */
	for(;;){
		if( n >= SX_ARRAYSIZE(aOpTable) ){
			break;
		}
		rc = SyStringCmp(pStr, &aOpTable[n].sOp, SyMemcmp);		
		if( rc == 0 ){
			if( aOpTable[n].sOp.nByte != sizeof(char) || (aOpTable[n].iOp != EXPR_OP_UMINUS && aOpTable[n].iOp != EXPR_OP_UPLUS) || pLast == 0 ){
				if( aOpTable[n].iOp == EXPR_OP_SUBSCRIPT && (pLast == 0 || (pLast->nType & (JX9_TK_ID|JX9_TK_CSB/*]*/|JX9_TK_RPAREN/*)*/)) == 0) ){
					/* JSON Array not subscripting, return NULL  */
					return 0;
				}
				/* There is no ambiguity here, simply return the first operator seen */
				return &aOpTable[n];
			}
			/* Handle ambiguity */
			if( pLast->nType & (JX9_TK_LPAREN/*'('*/|JX9_TK_OCB/*'{'*/|JX9_TK_OSB/*'['*/|JX9_TK_COLON/*:*/|JX9_TK_COMMA/*, '*/) ){
				/* Unary opertors have prcedence here over binary operators */
				return &aOpTable[n];
			}
			if( pLast->nType & JX9_TK_OP ){
				const jx9_expr_op *pOp = (const jx9_expr_op *)pLast->pUserData;
				/* Ticket 1433-31: Handle the '++', '--' operators case */
				if( pOp->iOp != EXPR_OP_INCR && pOp->iOp != EXPR_OP_DECR ){
					/* Unary opertors have prcedence here over binary operators */
					return &aOpTable[n];
				}
			
			}
		}
		++n; /* Next operator in the table */
	}
	/* No such operator */
	return 0;
}